

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O3

exr_result_t DwaCompressor_compress(DwaCompressor *me)

{
  uint64_t *encbytes;
  Classifier *pCVar1;
  uint8_t uVar2;
  exr_pixel_type_t eVar3;
  CompressorScheme CVar4;
  undefined8 *__s;
  exr_coding_channel_info_t *peVar5;
  char *pcVar6;
  CscChannelSet *pCVar7;
  uint8_t *puVar8;
  void *in;
  bool bVar9;
  undefined1 auVar10 [16];
  exr_result_t eVar11;
  int iVar12;
  char *pcVar13;
  ulong uVar14;
  size_t out_bytes_avail;
  size_t sVar15;
  uint64_t uVar16;
  size_t sVar17;
  exr_encode_pipeline_t *peVar18;
  ulong uVar19;
  ulong uVar20;
  unsigned_short *toNonlinear;
  int *piVar21;
  ChannelData *pCVar22;
  ulong uVar23;
  char *__s1;
  uint8_t *puVar24;
  int iVar25;
  long lVar26;
  size_t sVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  size_t readHere;
  LossyDctEncoder enc;
  void *local_2b8;
  uint8_t *local_2b0;
  ulong local_2a8;
  uint8_t *local_2a0;
  size_t local_288;
  LossyDctEncoder local_280;
  
  me->_channelRules = sDefaultChannelRules;
  me->_channelRuleCount = 0xf;
  local_288 = 0;
  DwaCompressor_initializeBuffers(me,&local_288);
  sVar17 = local_288;
  peVar18 = me->_encode;
  if (peVar18->compressed_alloc_size < 0x58) {
    return 1;
  }
  eVar11 = internal_encode_alloc_buffer
                     (peVar18,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar18->compressed_buffer,
                      &peVar18->compressed_alloc_size,local_288);
  if (eVar11 != 0) {
    return eVar11;
  }
  __s = (undefined8 *)me->_encode->compressed_buffer;
  memset(__s,0,me->_encode->compressed_alloc_size);
  if (sVar17 < 2) {
    return 1;
  }
  local_2b8 = (void *)((long)__s + 0x5a);
  uVar20 = me->_channelRuleCount;
  if (uVar20 == 0) {
    local_2a8 = 2;
    uVar20 = 0x5a;
  }
  else {
    local_2a8 = 2;
    uVar19 = 0;
    do {
      lVar28 = (long)me->_numChannels;
      if (lVar28 != 0) {
        pCVar22 = me->_channelData;
        pCVar1 = me->_channelRules + uVar19;
        eVar3 = pCVar1->_type;
        do {
          peVar5 = pCVar22->chan;
          pcVar6 = peVar5->channel_name;
          pcVar13 = strrchr(pcVar6,0x2e);
          __s1 = pcVar13 + 1;
          if (pcVar13 == (char *)0x0) {
            __s1 = pcVar6;
          }
          if (eVar3 == peVar5->data_type) {
            pcVar6 = pCVar1->_suffix;
            if (pCVar1->_caseInsensitive == '\0') {
              iVar12 = strcmp(__s1,pcVar6);
            }
            else {
              iVar12 = strcasecmp(__s1,pcVar6);
            }
            if (iVar12 == 0) {
              sVar27 = strlen(pcVar6);
              if (sVar17 < sVar27 + local_2a8 + 3) {
                return 1;
              }
              sVar27 = strlen(pcVar6);
              memcpy(local_2b8,pcVar6,sVar27 + 1);
              *(byte *)((long)local_2b8 + sVar27 + 1) =
                   ((char)(pCVar1->_cscIdx << 4) + ((byte)pCVar1->_scheme & 3) * '\x04' |
                   pCVar1->_caseInsensitive & 1) + 0x10;
              *(char *)((long)local_2b8 + sVar27 + 2) = (char)pCVar1->_type;
              local_2a8 = local_2a8 + 3 + sVar27;
              uVar20 = me->_channelRuleCount;
              local_2b8 = (void *)((long)local_2b8 + sVar27 + 3);
              break;
            }
          }
          pCVar22 = pCVar22 + 1;
          lVar28 = lVar28 + -1;
        } while (lVar28 != 0);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < uVar20);
    uVar20 = local_2a8 + 0x58;
  }
  *(short *)(__s + 0xb) = (short)local_2a8;
  if (me->_encode->compressed_alloc_size <= uVar20) {
    return 1;
  }
  local_2b0 = me->_packedAcBuffer;
  local_2a0 = me->_packedDcBuffer;
  *__s = 2;
  __s[10] = (ulong)me->_acCompression;
  DwaCompressor_setupChannelData(me);
  auVar10 = _DAT_0012a0e0;
  iVar12 = me->_numChannels;
  uVar19 = (ulong)iVar12;
  if (uVar19 != 0) {
    uVar14 = uVar19 + 3 & 0xfffffffffffffffc;
    lVar28 = uVar19 - 1;
    auVar29._8_4_ = (int)lVar28;
    auVar29._0_8_ = lVar28;
    auVar29._12_4_ = (int)((ulong)lVar28 >> 0x20);
    piVar21 = &me->_channelData[3].processed;
    auVar29 = auVar29 ^ _DAT_0012a0e0;
    auVar30 = _DAT_0012a0b0;
    auVar31 = _DAT_0012a0c0;
    do {
      auVar32 = auVar31 ^ auVar10;
      iVar25 = auVar29._4_4_;
      if ((bool)(~(auVar32._4_4_ == iVar25 && auVar29._0_4_ < auVar32._0_4_ ||
                  iVar25 < auVar32._4_4_) & 1)) {
        piVar21[-0x1b0] = 0;
      }
      if ((auVar32._12_4_ != auVar29._12_4_ || auVar32._8_4_ <= auVar29._8_4_) &&
          auVar32._12_4_ <= auVar29._12_4_) {
        piVar21[-0x120] = 0;
      }
      auVar32 = auVar30 ^ auVar10;
      iVar33 = auVar32._4_4_;
      if (iVar33 <= iVar25 && (iVar33 != iVar25 || auVar32._0_4_ <= auVar29._0_4_)) {
        piVar21[-0x90] = 0;
        *piVar21 = 0;
      }
      lVar28 = auVar31._8_8_;
      auVar31._0_8_ = auVar31._0_8_ + 4;
      auVar31._8_8_ = lVar28 + 4;
      lVar28 = auVar30._8_8_;
      auVar30._0_8_ = auVar30._0_8_ + 4;
      auVar30._8_8_ = lVar28 + 4;
      piVar21 = piVar21 + 0x240;
      uVar14 = uVar14 - 4;
    } while (uVar14 != 0);
  }
  iVar25 = me->_max[1];
  if (me->_min[1] <= iVar25) {
    puVar24 = (uint8_t *)me->_encode->packed_buffer;
    iVar33 = me->_min[1];
    do {
      if (iVar12 == 0) {
        iVar12 = 0;
      }
      else {
        lVar28 = 0x20;
        uVar14 = 0;
        do {
          lVar26 = *(long *)((long)(me->_channelData->_dctData)._dctData + lVar28 + -0x40);
          if (iVar33 % *(int *)(lVar26 + 0x14) == 0) {
            eVar11 = DctCoderChannelData_push_row
                               ((DctCoderChannelData *)
                                ((long)(me->_channelData->_dctData)._dctData + lVar28 + -0x20),
                                puVar24);
            if (eVar11 != 0) {
              return 1;
            }
            puVar24 = puVar24 + (long)*(char *)(lVar26 + 0x19) * (long)*(int *)(lVar26 + 0xc);
            uVar19 = (ulong)(uint)me->_numChannels;
          }
          uVar14 = uVar14 + 1;
          iVar12 = (int)uVar19;
          lVar28 = lVar28 + 0x240;
        } while (uVar14 < (ulong)(long)iVar12);
        iVar25 = me->_max[1];
      }
      bVar9 = iVar33 < iVar25;
      iVar33 = iVar33 + 1;
    } while (bVar9);
  }
  if (me->_numCscChannelSets != 0) {
    pCVar22 = me->_channelData;
    lVar28 = 8;
    uVar19 = 0;
    do {
      pCVar7 = me->_cscChannelSets;
      iVar12 = *(int *)((long)pCVar7->idx + lVar28 + -8);
      iVar25 = *(int *)((long)pCVar7->idx + lVar28 + -4);
      iVar33 = *(int *)((long)pCVar7->idx + lVar28);
      peVar5 = pCVar22[iVar12].chan;
      LossyDctEncoder_base_construct
                (&local_280,me->_dwaCompressionLevel / 100000.0,local_2b0,local_2a0,
                 dwaCompressorToNonlinear,peVar5->width,peVar5->height);
      local_280._channel_encode_data_count = 3;
      local_280._channel_encode_data[0] = &pCVar22[iVar12]._dctData;
      local_280._channel_encode_data[1] = &pCVar22[iVar25]._dctData;
      local_280._channel_encode_data[2] = &pCVar22[iVar33]._dctData;
      eVar11 = LossyDctEncoder_execute(&local_280);
      __s[8] = __s[8] + (long)local_280._numAcComp;
      __s[9] = __s[9] + (long)local_280._numDcComp;
      pCVar22 = me->_channelData;
      pCVar22[*(int *)((long)pCVar7->idx + lVar28 + -8)].processed = 1;
      pCVar22[*(int *)((long)pCVar7->idx + lVar28 + -4)].processed = 1;
      pCVar22[*(int *)((long)pCVar7->idx + lVar28)].processed = 1;
      if (eVar11 != 0) {
        return 1;
      }
      local_2a0 = local_2a0 + (long)local_280._numDcComp * 2;
      local_2b0 = local_2b0 + (long)local_280._numAcComp * 2;
      uVar19 = uVar19 + 1;
      lVar28 = lVar28 + 0xc;
    } while (uVar19 < (ulong)(long)me->_numCscChannelSets);
  }
  iVar12 = me->_numChannels;
  if (iVar12 != 0) {
    lVar28 = 0x210;
    uVar19 = 0;
    do {
      pCVar22 = me->_channelData;
      if (pCVar22[uVar19].processed == 0) {
        peVar5 = pCVar22[uVar19].chan;
        CVar4 = pCVar22[uVar19].compression;
        if (CVar4 == UNKNOWN) {
          if (pCVar22[uVar19]._dctData._size != 0) {
            sVar27 = (long)peVar5->bytes_per_element * (long)peVar5->width;
            puVar24 = pCVar22[uVar19].planarUncBufferEnd;
            uVar14 = 0;
            do {
              memcpy(puVar24,pCVar22[uVar19]._dctData._rows[uVar14],sVar27);
              puVar24 = pCVar22[uVar19].planarUncBufferEnd + sVar27;
              pCVar22[uVar19].planarUncBufferEnd = puVar24;
              uVar14 = uVar14 + 1;
            } while (uVar14 < pCVar22[uVar19]._dctData._size);
          }
          __s[1] = __s[1] + pCVar22[uVar19].planarUncSize;
        }
        else if (CVar4 == LOSSY_DCT) {
          toNonlinear = (uint16_t *)0x0;
          if (peVar5->p_linear == '\0') {
            toNonlinear = dwaCompressorToNonlinear;
          }
          LossyDctEncoder_base_construct
                    (&local_280,me->_dwaCompressionLevel / 100000.0,local_2b0,local_2a0,toNonlinear,
                     peVar5->width,peVar5->height);
          local_280._channel_encode_data_count = 1;
          local_280._channel_encode_data[0] = &pCVar22[uVar19]._dctData;
          eVar11 = LossyDctEncoder_execute(&local_280);
          __s[8] = __s[8] + (long)local_280._numAcComp;
          __s[9] = __s[9] + (long)local_280._numDcComp;
          if (eVar11 != 0) {
            return 1;
          }
          local_2b0 = local_2b0 + (long)local_280._numAcComp * 2;
          local_2a0 = local_2a0 + (long)local_280._numDcComp * 2;
        }
        else {
          if (CVar4 != RLE) {
            return 3;
          }
          if (pCVar22[uVar19]._dctData._size != 0) {
            iVar12 = peVar5->width;
            uVar23 = (ulong)(byte)peVar5->bytes_per_element;
            uVar14 = 0;
            do {
              if (0 < iVar12) {
                puVar24 = pCVar22[uVar19]._dctData._rows[uVar14];
                iVar25 = 0;
                do {
                  if ('\0' < (char)uVar23) {
                    lVar26 = 0;
                    do {
                      uVar2 = puVar24[lVar26];
                      puVar8 = *(uint8_t **)
                                ((long)(pCVar22->_dctData)._dctData + lVar26 * 8 + lVar28 + -0x20);
                      *(uint8_t **)
                       ((long)(pCVar22->_dctData)._dctData + lVar26 * 8 + lVar28 + -0x20) =
                           puVar8 + 1;
                      *puVar8 = uVar2;
                      lVar26 = lVar26 + 1;
                      uVar23 = (ulong)peVar5->bytes_per_element;
                    } while (lVar26 < (long)uVar23);
                    iVar12 = peVar5->width;
                    puVar24 = puVar24 + lVar26;
                  }
                  iVar25 = iVar25 + 1;
                } while (iVar25 < iVar12);
              }
              __s[7] = __s[7] + (long)((char)uVar23 * iVar12);
              uVar14 = uVar14 + 1;
            } while (uVar14 < pCVar22[uVar19]._dctData._size);
          }
        }
        pCVar22[uVar19].processed = 1;
        iVar12 = me->_numChannels;
      }
      uVar19 = uVar19 + 1;
      lVar28 = lVar28 + 0x240;
    } while (uVar19 < (ulong)(long)iVar12);
  }
  sVar15 = __s[1];
  local_2a8 = uVar20;
  if (sVar15 != 0) {
    puVar24 = me->_planarUncBuffer[0];
    out_bytes_avail = exr_compress_max_buffer_size(sVar15);
    eVar11 = exr_compress_buffer(9,puVar24,sVar15,local_2b8,out_bytes_avail,(size_t *)&local_280);
    if (eVar11 != 0) {
      return eVar11;
    }
    local_2b8 = (void *)((long)local_2b8 + local_280._0_8_);
    __s[2] = local_280._0_8_;
    local_2a8 = uVar20 + local_280._0_8_;
  }
  uVar16 = __s[8];
  if (uVar16 != 0) {
    encbytes = __s + 3;
    if (me->_acCompression == DEFLATE) {
      puVar24 = me->_packedAcBuffer;
      sVar17 = exr_compress_max_buffer_size(uVar16 * 2);
      eVar11 = exr_compress_buffer(9,puVar24,uVar16 * 2,local_2b8,sVar17,(size_t *)&local_280);
      if (eVar11 != 0) {
        return eVar11;
      }
      *encbytes = local_280._0_8_;
      uVar16 = local_280._0_8_;
    }
    else {
      if (me->_acCompression != STATIC_HUFFMAN) {
        return 3;
      }
      eVar11 = internal_huf_compress
                         (encbytes,local_2b8,(long)__s + (sVar17 - (long)local_2b8),
                          (uint16_t *)me->_packedAcBuffer,uVar16,me->_encode->scratch_buffer_1,
                          me->_encode->scratch_alloc_size_1);
      if (eVar11 == 4) {
        peVar18 = me->_encode;
        memcpy(peVar18->compressed_buffer,peVar18->packed_buffer,peVar18->packed_alloc_size);
        peVar18 = me->_encode;
        sVar17 = peVar18->packed_alloc_size;
        goto LAB_0010a125;
      }
      if (eVar11 != 0) {
        return eVar11;
      }
      uVar16 = *encbytes;
    }
    local_2b8 = (void *)((long)local_2b8 + uVar16);
    local_2a8 = local_2a8 + uVar16;
  }
  if (__s[9] != 0) {
    sVar17 = __s[9] * 2;
    peVar18 = me->_encode;
    eVar11 = internal_encode_alloc_buffer
                       (peVar18,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar18->scratch_buffer_1,
                        &peVar18->scratch_alloc_size_1,sVar17);
    if (eVar11 != 0) {
      return eVar11;
    }
    internal_zip_deconstruct_bytes
              ((uint8_t *)me->_encode->scratch_buffer_1,me->_packedDcBuffer,sVar17);
    iVar12 = me->_zipLevel;
    in = me->_encode->scratch_buffer_1;
    sVar15 = exr_compress_max_buffer_size(sVar17);
    eVar11 = exr_compress_buffer(iVar12,in,sVar17,local_2b8,sVar15,(size_t *)&local_280);
    if (eVar11 != 0) {
      return eVar11;
    }
    __s[4] = local_280._0_8_;
    local_2b8 = (void *)((long)local_2b8 + local_280._0_8_);
    local_2a8 = local_2a8 + local_280._0_8_;
  }
  if (__s[7] != 0) {
    uVar16 = internal_rle_compress(me->_rleBuffer,me->_rleBufferSize,me->_planarUncBuffer[2],__s[7])
    ;
    __s[6] = uVar16;
    puVar24 = me->_rleBuffer;
    sVar17 = exr_compress_max_buffer_size(uVar16);
    eVar11 = exr_compress_buffer(9,puVar24,uVar16,local_2b8,sVar17,(size_t *)&local_280);
    if (eVar11 != 0) {
      return eVar11;
    }
    __s[5] = local_280._0_8_;
    local_2b8 = (void *)((long)local_2b8 + local_280._0_8_);
    local_2a8 = local_2a8 + local_280._0_8_;
  }
  peVar18 = me->_encode;
  if (local_2a8 != (long)local_2b8 - (long)peVar18->compressed_buffer) {
    return 0x17;
  }
  if (local_2a8 < peVar18->packed_bytes) {
    peVar18->compressed_bytes = local_2a8;
    return 0;
  }
  memcpy(peVar18->compressed_buffer,peVar18->packed_buffer,peVar18->packed_bytes);
  peVar18 = me->_encode;
  sVar17 = peVar18->packed_bytes;
LAB_0010a125:
  peVar18->compressed_bytes = sVar17;
  return 0;
}

Assistant:

exr_result_t
DwaCompressor_compress (DwaCompressor* me)
{
    exr_result_t rv;
    uint8_t*     outPtr;
    uint64_t     outBufferSize = 0;
    uint64_t     nWritten      = 0;
    uint64_t     nAvail;
    int          fileVersion = 2;

    // Starting with 2, we write the channel
    // classification rules into the file
    if (fileVersion < 2)
    {
        me->_channelRules = sLegacyChannelRules;
        me->_channelRuleCount =
            sizeof (sLegacyChannelRules) / sizeof (Classifier);
    }
    else
    {
        me->_channelRules = sDefaultChannelRules;
        me->_channelRuleCount =
            sizeof (sDefaultChannelRules) / sizeof (Classifier);
    }

    size_t readHere = 0;
    rv = DwaCompressor_initializeBuffers (me, &readHere);
    outBufferSize = readHere;

    nAvail = me->_encode->compressed_alloc_size;
    if (nAvail < (NUM_SIZES_SINGLE * sizeof (uint64_t)))
        return EXR_ERR_OUT_OF_MEMORY;

    rv = internal_encode_alloc_buffer (
        me->_encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(me->_encode->compressed_buffer),
        &(me->_encode->compressed_alloc_size),
        outBufferSize);
    if (rv != EXR_ERR_SUCCESS) return rv;

    nAvail          = outBufferSize;
    uint64_t* sizes = (uint64_t*) me->_encode->compressed_buffer;

    //
    // Zero all the numbers in the chunk header
    //
    //    memset (sizes, 0, NUM_SIZES_SINGLE * sizeof (uint64_t));
    memset (sizes, 0, me->_encode->compressed_alloc_size);

#define OBIDX(x) (uint64_t*) (sizes + x)

    uint64_t* version                 = OBIDX (VERSION);
    uint64_t* unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    uint64_t* unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    uint64_t* acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    uint64_t* dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    uint64_t* rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    uint64_t* rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    uint64_t* rleRawSize              = OBIDX (RLE_RAW_SIZE);

    uint64_t* totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    uint64_t* totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    uint64_t* acCompression = OBIDX (AC_COMPRESSION);
    uint8_t*  packedAcEnd   = NULL;
    uint8_t*  packedDcEnd   = NULL;

    // Now write in the channel rules...
    outPtr = (uint8_t*) (sizes + NUM_SIZES_SINGLE);
    if (rv == EXR_ERR_SUCCESS && fileVersion >= 2)
    {
        rv = DwaCompressor_writeRelevantChannelRules (
            me, &outPtr, nAvail, &nWritten);
    }

    // post add this so we have a 0 value for the relevant channel
    // rules to fill up
    nWritten += NUM_SIZES_SINGLE * sizeof (uint64_t);

    if (rv != EXR_ERR_SUCCESS || nWritten >= me->_encode->compressed_alloc_size)
        return EXR_ERR_OUT_OF_MEMORY;

    uint8_t* outDataPtr   = outPtr;

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and dereferencing
    // a vector will not be a good thing to do.
    //

    if (me->_packedAcBuffer) packedAcEnd = me->_packedAcBuffer;
    if (me->_packedDcBuffer) packedDcEnd = me->_packedDcBuffer;

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;
    *acCompression = me->_acCompression;

    rv = DwaCompressor_setupChannelData (me);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //
    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        me->_channelData[c].processed = 0;
    }

    uint8_t* inDataPtr = (uint8_t*) me->_encode->packed_buffer;

    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
    {
        for (size_t c = 0; c < me->_numChannels; ++c)
        {
            ChannelData*               cd   = &(me->_channelData[c]);
            exr_coding_channel_info_t* chan = cd->chan;

            if ((y % chan->y_samples) != 0) continue;

            rv = DctCoderChannelData_push_row (&(cd->_dctData), inDataPtr);
            if (rv != EXR_ERR_SUCCESS) return rv;

            inDataPtr += chan->width * chan->bytes_per_element;
        }
    }

    //
    // Make a pass over all our CSC sets and try to encode them first
    //

    for (size_t csc = 0; csc < me->_numCscChannelSets; ++csc)
    {
        LossyDctEncoder enc;
        CscChannelSet*  cset = &(me->_cscChannelSets[csc]);

        rv = LossyDctEncoderCsc_construct (
            &enc,
            me->_dwaCompressionLevel / 100000.f,
            &(me->_channelData[cset->idx[0]]._dctData),
            &(me->_channelData[cset->idx[1]]._dctData),
            &(me->_channelData[cset->idx[2]]._dctData),
            packedAcEnd,
            packedDcEnd,
            dwaCompressorToNonlinear,
            me->_channelData[cset->idx[0]].chan->width,
            me->_channelData[cset->idx[0]].chan->height);

        if (rv == EXR_ERR_SUCCESS) rv = LossyDctEncoder_execute (&enc);

        *totalAcUncompressedCount = *totalAcUncompressedCount + enc._numAcComp;
        *totalDcUncompressedCount = *totalDcUncompressedCount + enc._numDcComp;

        packedAcEnd += enc._numAcComp * sizeof (uint16_t);
        packedDcEnd += enc._numDcComp * sizeof (uint16_t);

        me->_channelData[cset->idx[0]].processed = 1;
        me->_channelData[cset->idx[1]].processed = 1;
        me->_channelData[cset->idx[2]].processed = 1;

        LossyDctEncoder_destroy (&enc);
        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    for (size_t chan = 0; chan < me->_numChannels; ++chan)
    {
        ChannelData*               cd    = &(me->_channelData[chan]);
        exr_coding_channel_info_t* pchan = cd->chan;

        if (cd->processed) continue;

        switch (cd->compression)
        {
            case LOSSY_DCT:
                //
                // For LOSSY_DCT, treat this just like the CSC'd case,
                // but only operate on one channel
                //
                {
                    LossyDctEncoder       enc;
                    const unsigned short* nonlinearLut = NULL;

                    if (!pchan->p_linear)
                        nonlinearLut = dwaCompressorToNonlinear;

                    rv = LossyDctEncoder_construct (
                        &enc,
                        me->_dwaCompressionLevel / 100000.f,
                        &(cd->_dctData),
                        packedAcEnd,
                        packedDcEnd,
                        nonlinearLut,
                        pchan->width,
                        pchan->height);

                    if (rv == EXR_ERR_SUCCESS)
                        rv = LossyDctEncoder_execute (&enc);

                    *totalAcUncompressedCount =
                        *totalAcUncompressedCount + enc._numAcComp;
                    *totalDcUncompressedCount =
                        *totalDcUncompressedCount + enc._numDcComp;

                    packedAcEnd += enc._numAcComp * sizeof (uint16_t);
                    packedDcEnd += enc._numDcComp * sizeof (uint16_t);

                    LossyDctEncoder_destroy (&enc);
                    if (rv != EXR_ERR_SUCCESS) return rv;
                }
                break;

            case RLE: {
                //
                // For RLE, bash the bytes up so that the first bytes of each
                // pixel are contiguous, as are the second bytes, and so on.
                //
                DctCoderChannelData* dcd = &(cd->_dctData);
                for (size_t y = 0; y < dcd->_size; ++y)
                {
                    const uint8_t* row = dcd->_rows[y];

                    for (int x = 0; x < pchan->width; ++x)
                    {
                        for (int byte = 0; byte < pchan->bytes_per_element;
                             ++byte)
                        {
                            *cd->planarUncRleEnd[byte]++ = *row++;
                        }
                    }

                    *rleRawSize += pchan->width * pchan->bytes_per_element;
                }

                break;
            }

            case UNKNOWN:

                //
                // Otherwise, just copy data over verbatim
                //

                {
                    size_t scanlineSize =
                        pchan->width * pchan->bytes_per_element;
                    DctCoderChannelData* dcd = &(cd->_dctData);
                    for (size_t y = 0; y < dcd->_size; ++y)
                    {
                        memcpy (
                            cd->planarUncBufferEnd,
                            dcd->_rows[y],
                            scanlineSize);

                        cd->planarUncBufferEnd += scanlineSize;
                    }

                    *unknownUncompressedSize += cd->planarUncSize;
                }

                break;

            default: return EXR_ERR_INVALID_ARGUMENT;
        }

        cd->processed = DWA_CLASSIFIER_TRUE;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        size_t outSize;

        rv = exr_compress_buffer (
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_planarUncBuffer[UNKNOWN],
            *unknownUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*unknownUncompressedSize),
            &outSize);
        if (rv != EXR_ERR_SUCCESS)
        {
            return rv;
            //throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
        }

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
        nWritten += outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    {
        switch (me->_acCompression)
        {
            case STATIC_HUFFMAN: {
                size_t outDataSize =
                    outBufferSize -
                    (size_t) ((uintptr_t) outDataPtr - (uintptr_t) sizes);

                rv = internal_huf_compress (
                    acCompressedSize,
                    outDataPtr,
                    outDataSize,
                    (const uint16_t*) me->_packedAcBuffer,
                    *totalAcUncompressedCount,
                    me->_encode->scratch_buffer_1,
                    me->_encode->scratch_alloc_size_1);
                if (rv != EXR_ERR_SUCCESS)
                {
                    if (rv == EXR_ERR_ARGUMENT_OUT_OF_RANGE)
                    {
                        memcpy (
                            me->_encode->compressed_buffer,
                            me->_encode->packed_buffer,
                            me->_encode->packed_alloc_size);
                        me->_encode->compressed_bytes =
                            me->_encode->packed_alloc_size;
                        return EXR_ERR_SUCCESS;
                    }
                    return rv;
                    //throw IEX_NAMESPACE::InputExc (
                    //    "Data compression (HUF) failed.");
                }
                break;
            }

            case DEFLATE: {
                size_t sourceLen =
                    *totalAcUncompressedCount * sizeof (uint16_t);
                size_t destLen;

                rv = exr_compress_buffer (
                    9, // TODO: use default??? the old call to zlib had 9 hardcoded
                    me->_packedAcBuffer,
                    sourceLen,
                    outDataPtr,
                    exr_compress_max_buffer_size (sourceLen),
                    &destLen);
                if (rv != EXR_ERR_SUCCESS)
                {
                    return rv;
                    //throw IEX_NAMESPACE::InputExc (
                    //    "Data compression (zlib) failed.");
                }

                *acCompressedSize = destLen;
                break;
            }

            default:
                return EXR_ERR_INVALID_ARGUMENT;
                //assert (false);
        }

        outDataPtr += *acCompressedSize;
        nWritten += *acCompressedSize;
    }

    //
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        size_t compBytes;
        size_t uncompBytes = *totalDcUncompressedCount * sizeof (uint16_t);

        rv = internal_encode_alloc_buffer (
            me->_encode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(me->_encode->scratch_buffer_1),
            &(me->_encode->scratch_alloc_size_1),
            uncompBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        internal_zip_deconstruct_bytes (
            (uint8_t*) me->_encode->scratch_buffer_1,
            (const uint8_t*) me->_packedDcBuffer, uncompBytes);

        rv = exr_compress_buffer (
            me->_zipLevel,
            me->_encode->scratch_buffer_1,
            uncompBytes,
            outDataPtr,
            exr_compress_max_buffer_size (uncompBytes),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        *dcCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //

    if (*rleRawSize > 0)
    {
        *rleUncompressedSize = internal_rle_compress (
            me->_rleBuffer,
            me->_rleBufferSize,
            me->_planarUncBuffer[RLE],
            *rleRawSize);

        size_t compBytes;
        rv = exr_compress_buffer (
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_rleBuffer,
            *rleUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*rleUncompressedSize),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;
        //throw IEX_NAMESPACE::BaseExc ("Error compressing RLE'd data.");

        *rleCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // Flip the counters to XDR format
    //
    priv_from_native64 (sizes, NUM_SIZES_SINGLE);

    size_t dataBytes =
        (uintptr_t) outDataPtr - (uintptr_t) me->_encode->compressed_buffer;
    if (nWritten != dataBytes) { return EXR_ERR_CORRUPT_CHUNK; }

    if (nWritten >= me->_encode->packed_bytes)
    {
        memcpy (
            me->_encode->compressed_buffer,
            me->_encode->packed_buffer,
            me->_encode->packed_bytes);
        me->_encode->compressed_bytes = me->_encode->packed_bytes;
    }
    else { me->_encode->compressed_bytes = nWritten; }
    return rv;
}